

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

size_t phf_primeup(size_t n)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  if (n >> 2 < 0x3fffffff) {
    do {
      if (n < 8) {
        if ((0xaeUL >> (n & 0x3f) & 1) != 0) {
          return n;
        }
      }
      else {
        uVar2 = 2;
        do {
          if (((0x51UL >> (uVar2 & 0x3f) & 1) == 0) &&
             (n % (ulong)(long)*(char *)((long)&phf_isprime(unsigned_long)::map + uVar2) == 0))
          goto LAB_00114ed3;
          uVar2 = uVar2 + 1;
        } while (uVar2 != 8);
        if (n >> 0x20 != 0) {
          __assert_fail("n <= UINT32_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                        ,0x93,"bool phf_rabinmiller(uint64_t)");
        }
        if ((n & 1) != 0) {
          uVar2 = n - 1;
          lVar8 = 1;
          uVar3 = uVar2;
          do {
            lVar9 = lVar8;
            uVar10 = uVar3 >> 1;
            uVar5 = uVar3 & 2;
            lVar8 = lVar9 + 1;
            uVar3 = uVar10;
          } while (uVar5 == 0);
          if (0x7ea < n) {
            lVar8 = 0;
            do {
              uVar3 = (ulong)(int)(&phf_rabinmiller(unsigned_long)::witness)[lVar8];
              if (n <= uVar3) {
                __assert_fail("a > 0 && a < n",
                              "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                              ,0x7c,"bool phf_witness(uint64_t, uint64_t, uint64_t, uint64_t)");
              }
              uVar4 = 1;
              uVar5 = uVar10;
              do {
                uVar3 = uVar3 % n;
                if ((uVar5 & 1) != 0) {
                  uVar4 = (uVar4 * uVar3) % n;
                }
                uVar3 = uVar3 * uVar3;
                bVar1 = 1 < uVar5;
                uVar5 = uVar5 >> 1;
              } while (bVar1);
              lVar6 = lVar9;
              if (uVar4 != uVar2 && uVar4 != 1) {
                do {
                  if (lVar6 + -1 == 0) goto LAB_00114ed3;
                  uVar4 = (uVar4 * uVar4) % n;
                  lVar6 = lVar6 + -1;
                } while (uVar4 != uVar2);
              }
              lVar8 = lVar8 + 1;
              if (lVar8 == 3) {
                return n;
              }
            } while( true );
          }
          uVar3 = 1;
          uVar5 = 2;
          do {
            uVar5 = uVar5 % n;
            if ((uVar10 & 1) != 0) {
              uVar3 = (uVar3 * uVar5) % n;
            }
            uVar5 = uVar5 * uVar5;
            bVar1 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar1);
          if (uVar3 == 1) {
            return n;
          }
          while( true ) {
            if (uVar3 == uVar2) {
              return n;
            }
            lVar9 = lVar9 + -1;
            if (lVar9 == 0) break;
            uVar3 = (uVar3 * uVar3) % n;
          }
        }
      }
LAB_00114ed3:
      n = n + 1;
    } while (n != 0xffffffffffffffff);
    sVar7 = 0xffffffffffffffff;
  }
  else {
    sVar7 = 0;
  }
  return sVar7;
}

Assistant:

static inline size_t phf_primeup(size_t n) {
	/* NB: 4294967291 is largest 32-bit prime */
	if (n > 4294967291)
		return 0;

	while (n < SIZE_MAX && !phf_isprime(n))
		n++;

	return n;
}